

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_1::getNBitIntegerMinValue(bool isSigned,int numBits)

{
  int numBits_local;
  bool isSigned_local;
  
  if (numBits == 0) {
    numBits_local = 0;
  }
  else if (isSigned) {
    numBits_local = deIntMinValue32(numBits);
  }
  else {
    numBits_local = 0;
  }
  return numBits_local;
}

Assistant:

int getNBitIntegerMinValue (bool isSigned, int numBits)
{
	DE_ASSERT(numBits < 32);

	if (numBits == 0)
		return 0;
	else if (isSigned)
		return deIntMinValue32(numBits);
	else
		return 0;
}